

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

void __thiscall MODEL3D::three_dim_model::initialize_python_script(three_dim_model *this)

{
  allocator<char> local_11b1;
  value_type local_11b0;
  allocator<char> local_1189;
  value_type local_1188;
  allocator<char> local_1161;
  value_type local_1160;
  allocator<char> local_1139;
  value_type local_1138;
  allocator<char> local_1111;
  value_type local_1110;
  allocator<char> local_10e9;
  value_type local_10e8;
  allocator<char> local_10c1;
  value_type local_10c0;
  allocator<char> local_1099;
  value_type local_1098;
  allocator<char> local_1071;
  value_type local_1070;
  allocator<char> local_1049;
  value_type local_1048;
  allocator<char> local_1021;
  value_type local_1020;
  allocator<char> local_ff9;
  value_type local_ff8;
  allocator<char> local_fd1;
  value_type local_fd0;
  allocator<char> local_fa9;
  value_type local_fa8;
  allocator<char> local_f81;
  value_type local_f80;
  allocator<char> local_f59;
  value_type local_f58;
  allocator<char> local_f31;
  value_type local_f30;
  allocator<char> local_f09;
  value_type local_f08;
  allocator<char> local_ee1;
  value_type local_ee0;
  allocator<char> local_eb9;
  value_type local_eb8;
  allocator<char> local_e91;
  value_type local_e90;
  allocator<char> local_e69;
  value_type local_e68;
  allocator<char> local_e41;
  value_type local_e40;
  allocator<char> local_e19;
  value_type local_e18;
  allocator<char> local_df1;
  value_type local_df0;
  allocator<char> local_dc9;
  value_type local_dc8;
  allocator<char> local_da1;
  value_type local_da0;
  allocator<char> local_d79;
  value_type local_d78;
  allocator<char> local_d51;
  value_type local_d50;
  allocator<char> local_d29;
  value_type local_d28;
  allocator<char> local_d01;
  value_type local_d00;
  allocator<char> local_cd9;
  value_type local_cd8;
  allocator<char> local_cb1;
  value_type local_cb0;
  allocator<char> local_c89;
  value_type local_c88;
  allocator<char> local_c61;
  value_type local_c60;
  allocator<char> local_c39;
  value_type local_c38;
  allocator<char> local_c11;
  value_type local_c10;
  allocator<char> local_be9;
  value_type local_be8;
  allocator<char> local_bc1;
  value_type local_bc0;
  allocator<char> local_b99;
  value_type local_b98;
  allocator<char> local_b71;
  value_type local_b70;
  allocator<char> local_b49;
  value_type local_b48;
  allocator<char> local_b21;
  value_type local_b20;
  allocator<char> local_af9;
  value_type local_af8;
  allocator<char> local_ad1;
  value_type local_ad0;
  allocator<char> local_aa9;
  value_type local_aa8;
  allocator<char> local_a81;
  value_type local_a80;
  allocator<char> local_a59;
  value_type local_a58;
  allocator<char> local_a31;
  value_type local_a30;
  allocator<char> local_a09;
  value_type local_a08;
  allocator<char> local_9e1;
  value_type local_9e0;
  allocator<char> local_9b9;
  value_type local_9b8;
  allocator<char> local_991;
  value_type local_990;
  allocator<char> local_969;
  value_type local_968;
  allocator<char> local_941;
  value_type local_940;
  allocator<char> local_919;
  value_type local_918;
  allocator<char> local_8f1;
  value_type local_8f0;
  allocator<char> local_8c9;
  value_type local_8c8;
  allocator<char> local_8a1;
  value_type local_8a0;
  allocator<char> local_879;
  value_type local_878;
  allocator<char> local_851;
  value_type local_850;
  allocator<char> local_829;
  value_type local_828;
  allocator<char> local_801;
  value_type local_800;
  allocator<char> local_7d9;
  value_type local_7d8;
  allocator<char> local_7b1;
  value_type local_7b0;
  allocator<char> local_789;
  value_type local_788;
  allocator<char> local_761;
  value_type local_760;
  allocator<char> local_739;
  value_type local_738;
  allocator<char> local_711;
  value_type local_710;
  allocator<char> local_6e9;
  value_type local_6e8;
  allocator<char> local_6c1;
  value_type local_6c0;
  allocator<char> local_699;
  value_type local_698;
  allocator<char> local_671;
  value_type local_670;
  allocator<char> local_649;
  value_type local_648;
  allocator<char> local_621;
  value_type local_620;
  allocator<char> local_5f9;
  value_type local_5f8;
  allocator<char> local_5d1;
  value_type local_5d0;
  allocator<char> local_5a9;
  value_type local_5a8;
  allocator<char> local_581;
  value_type local_580;
  allocator<char> local_559;
  value_type local_558;
  allocator<char> local_531;
  value_type local_530;
  allocator<char> local_509;
  value_type local_508;
  allocator<char> local_4e1;
  value_type local_4e0;
  allocator<char> local_4b9;
  value_type local_4b8;
  allocator<char> local_491;
  value_type local_490;
  allocator<char> local_469;
  value_type local_468;
  allocator<char> local_441;
  value_type local_440;
  allocator<char> local_419;
  value_type local_418;
  allocator<char> local_3f1;
  value_type local_3f0;
  allocator<char> local_3c9;
  value_type local_3c8;
  allocator<char> local_3a1;
  value_type local_3a0;
  allocator<char> local_379;
  value_type local_378;
  allocator<char> local_351;
  value_type local_350;
  allocator<char> local_329;
  value_type local_328;
  allocator<char> local_301;
  value_type local_300;
  allocator<char> local_2d9;
  value_type local_2d8;
  allocator<char> local_2b1;
  value_type local_2b0;
  allocator<char> local_289;
  value_type local_288;
  allocator<char> local_261;
  value_type local_260;
  allocator<char> local_239;
  value_type local_238;
  allocator<char> local_211;
  value_type local_210;
  allocator<char> local_1e9;
  value_type local_1e8;
  allocator<char> local_1c1;
  value_type local_1c0;
  allocator<char> local_199;
  value_type local_198;
  allocator<char> local_171;
  value_type local_170;
  allocator<char> local_149;
  value_type local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator<char> local_e1;
  value_type local_e0;
  allocator<char> local_b9;
  value_type local_b8;
  allocator<char> local_91;
  value_type local_90;
  allocator<char> local_69;
  value_type local_68;
  allocator<char> local_31;
  value_type local_30;
  three_dim_model *local_10;
  three_dim_model *this_local;
  
  local_10 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->py_script);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"\"\"\"Python Circuit TCAD Script Generated with Katana\"\"\"",
             &local_31);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"# Initialization ================================================"
             ,&local_69);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"import FreeCAD, Part, time",&local_91);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  if ((this->enable_multiprocessing & 1U) == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"import concurrent.futures",&local_b9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"from FreeCAD import Base",&local_e1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::operator+(&local_128,"My_doc = FreeCAD.newDocument(\"",&this->cell_name);
  std::operator+(&local_108,&local_128,"\")");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"",&local_149);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,
             "# Set up functions ==============================================",&local_171);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"class Ingredient:",&local_199);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,"    def __init__(self, gp, ct, ps, sb, of):",&local_1c1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"        self.gp = gp                        # Ground Plane",
             &local_1e9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"        self.ct = ct                        # Contour",&local_211
            );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"        self.ps = ps                        # Position",
             &local_239);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,
             "        self.sb = sb                        # Start Base (True/False",&local_261);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_288,"        self.of = of \t\t\t\t         # Overlap Factor",
             &local_289);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"",&local_2b1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_2b0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"def create_pss(f_ingr):",&local_2d9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"    #convert base and contour to freecad vector",&local_301);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"    ts = time.perf_counter()",&local_329);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_350,"    fc_gp = [FreeCAD.Vector(i) for i in f_ingr.gp]",&local_351);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"    fc_ct = [FreeCAD.Vector(i) for i in f_ingr.ct]",&local_379);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a0,"    fc_ps = FreeCAD.Vector(f_ingr.ps)",&local_3a1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"    #create the shape",&local_3c9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"    wire = Part.makePolygon(fc_gp)",&local_3f1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"    gwire = Part.Wire(wire)",&local_419);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,"    last_p = len(fc_ct)-1",&local_441);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"    last_p_z = fc_ct[last_p].z",&local_469);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_490,"    spline = Part.BSplineCurve(fc_ct)",&local_491);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_490);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"    if (f_ingr.sb==True): # not inverted",&local_4b9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"        if ((f_ingr.of>1)and(f_ingr.of<=2)):#has overlap scale",
             &local_4e1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,
             "            offset_lower_pt = FreeCAD.Vector(-fc_ct[last_p].x*f_ingr.of, fc_ct[0].y, fc_ct[0].z)"
             ,&local_509);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_508);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator(&local_509);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,
             "            offset_upper_pt = FreeCAD.Vector(offset_lower_pt.x, fc_ct[last_p].y, fc_ct[last_p].z)"
             ,&local_531);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_530);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator(&local_531);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,
             "            offset_ln = Part.LineSegment(spline.StartPoint, offset_lower_pt)",
             &local_559);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_580,
             "            vert_ln = Part.LineSegment(offset_lower_pt, offset_upper_pt)",&local_581);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_580);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator(&local_581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,
             "            horiz_ln = Part.LineSegment(offset_upper_pt, spline.EndPoint)",&local_5a9)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_5a8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,
             "            profile = Part.Shape([offset_ln, vert_ln, horiz_ln, spline])",&local_5d1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"        elif ( f_ingr.of == 1 ):#no overlap scale",&local_5f9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_5f8);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,
             "            upper_point = FreeCAD.Vector(spline.StartPoint.x, spline.StartPoint.y, spline.EndPoint.z)"
             ,&local_621);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_620);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,
             "            vertical_ln = Part.LineSegment(spline.StartPoint, upper_point)",&local_649
            );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_648);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_670,
             "            horiz_ln = Part.LineSegment(upper_point, spline.EndPoint)",&local_671);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_670);
  std::__cxx11::string::~string((string *)&local_670);
  std::allocator<char>::~allocator(&local_671);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_698,
             "            profile = Part.Shape([vertical_ln, horiz_ln, spline])",&local_699);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_698);
  std::__cxx11::string::~string((string *)&local_698);
  std::allocator<char>::~allocator(&local_699);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c0,"        else:",&local_6c1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_6c0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,
             "            raise Exception(\'Overlap factor must be within the range [1, 2]\')",
             &local_6e9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_6e8);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::allocator<char>::~allocator(&local_6e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_710,"        profile_wire = Part.Wire(profile.Edges)",&local_711);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_710);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator(&local_711);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_738,
             "        pl = FreeCAD.Placement(FreeCAD.Vector(0,0,0), FreeCAD.Rotation(FreeCAD.Vector(0,0,1), 180))"
             ,&local_739);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_738);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator(&local_739);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_760,"        profile_wire.Placement = pl",&local_761);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_760);
  std::__cxx11::string::~string((string *)&local_760);
  std::allocator<char>::~allocator(&local_761);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_788,"    else: # inverted",&local_789);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_788);
  std::__cxx11::string::~string((string *)&local_788);
  std::allocator<char>::~allocator(&local_789);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b0,"        if ((f_ingr.of>1)and(f_ingr.of<=2)): #has overlap scale",
             &local_7b1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_7b0);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator(&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,"            spline_end = fc_ct[last_p]",&local_7d9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_7d8);
  std::__cxx11::string::~string((string *)&local_7d8);
  std::allocator<char>::~allocator(&local_7d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_800,
             "            offset_point = FreeCAD.Vector( (fc_ct[last_p].x*f_ingr.of), fc_ct[last_p].y, fc_ct[last_p].z )"
             ,&local_801);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_800);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator(&local_801);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_828,
             "            offset_upper = Part.LineSegment(spline_end, offset_point)",&local_829);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_828);
  std::__cxx11::string::~string((string *)&local_828);
  std::allocator<char>::~allocator(&local_829);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_850,"            base_point = FreeCAD.Vector(offset_point.x,0,0)",
             &local_851);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_850);
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator(&local_851);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_878,"            vert_ln = Part.LineSegment(offset_point, base_point)"
             ,&local_879);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_878);
  std::__cxx11::string::~string((string *)&local_878);
  std::allocator<char>::~allocator(&local_879);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a0,
             "            horiz_ln = Part.LineSegment(base_point, spline.StartPoint)",&local_8a1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_8a0);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::allocator<char>::~allocator(&local_8a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8c8,
             "            profile = Part.Shape([spline, offset_upper, vert_ln, horiz_ln])",
             &local_8c9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_8c8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::allocator<char>::~allocator(&local_8c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f0,"        elif (f_ingr.of==1):#no overlap scale",&local_8f1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_8f0);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::allocator<char>::~allocator(&local_8f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_918,
             "            lower_point = FreeCAD.Vector(spline.EndPoint.x, spline.EndPoint.y, 0)",
             &local_919);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_918);
  std::__cxx11::string::~string((string *)&local_918);
  std::allocator<char>::~allocator(&local_919);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_940,
             "            vert_ln = Part.LineSegment(spline.EndPoint, lower_point)",&local_941);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_940);
  std::__cxx11::string::~string((string *)&local_940);
  std::allocator<char>::~allocator(&local_941);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_968,
             "            horiz_ln = Part.LineSegment(lower_point, spline.StartPoint)",&local_969);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_968);
  std::__cxx11::string::~string((string *)&local_968);
  std::allocator<char>::~allocator(&local_969);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_990,"            profile = Part.Shape([spline, vert_ln, horiz_ln])",
             &local_991);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_990);
  std::__cxx11::string::~string((string *)&local_990);
  std::allocator<char>::~allocator(&local_991);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9b8,"        else:",&local_9b9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_9b8);
  std::__cxx11::string::~string((string *)&local_9b8);
  std::allocator<char>::~allocator(&local_9b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9e0,
             "            raise Exception(\'Overlap factor must be within the range [1, 2]\')",
             &local_9e1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_9e0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::allocator<char>::~allocator(&local_9e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a08,"        profile_wire = Part.Wire(profile.Edges)",&local_a09);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_a08);
  std::__cxx11::string::~string((string *)&local_a08);
  std::allocator<char>::~allocator(&local_a09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a30,
             "        pl = FreeCAD.Placement(FreeCAD.Vector(-fc_ct[last_p].x,0,0), FreeCAD.Rotation(FreeCAD.Vector(0,0,1), 0))"
             ,&local_a31);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_a30);
  std::__cxx11::string::~string((string *)&local_a30);
  std::allocator<char>::~allocator(&local_a31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a58,"        profile_wire.Placement = pl",&local_a59);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_a58);
  std::__cxx11::string::~string((string *)&local_a58);
  std::allocator<char>::~allocator(&local_a59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a80,"    makeSolid=True",&local_a81);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_a80);
  std::__cxx11::string::~string((string *)&local_a80);
  std::allocator<char>::~allocator(&local_a81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_aa8,"    isFrenet=True",&local_aa9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_aa8);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::allocator<char>::~allocator(&local_aa9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ad0,"    TransitionMode=2#rounded edges",&local_ad1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_ad0);
  std::__cxx11::string::~string((string *)&local_ad0);
  std::allocator<char>::~allocator(&local_ad1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_af8,
             "    os = gwire.makePipeShell([profile_wire],makeSolid,isFrenet, TransitionMode)",
             &local_af9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_af8);
  std::__cxx11::string::~string((string *)&local_af8);
  std::allocator<char>::~allocator(&local_af9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b20,"    os=os.removeSplitter()",&local_b21);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_b20);
  std::__cxx11::string::~string((string *)&local_b20);
  std::allocator<char>::~allocator(&local_b21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b48,"    if os.isNull()==True:",&local_b49);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_b48);
  std::__cxx11::string::~string((string *)&local_b48);
  std::allocator<char>::~allocator(&local_b49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b70,
             "        raise Exception(\'Prismatic Spline Sweep creation failed: sweep is null.\')",
             &local_b71);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_b70);
  std::__cxx11::string::~string((string *)&local_b70);
  std::allocator<char>::~allocator(&local_b71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b98,"    face = Part.Face(wire)",&local_b99);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_b98);
  std::__cxx11::string::~string((string *)&local_b98);
  std::allocator<char>::~allocator(&local_b99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bc0,"    prism = face.extrude(FreeCAD.Vector(0,0,last_p_z))",
             &local_bc1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_bc0);
  std::__cxx11::string::~string((string *)&local_bc0);
  std::allocator<char>::~allocator(&local_bc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_be8,"    final_pss = os.fuse(prism)",&local_be9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_be8);
  std::__cxx11::string::~string((string *)&local_be8);
  std::allocator<char>::~allocator(&local_be9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c10,"    if final_pss.isNull()==True:",&local_c11);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_c10);
  std::__cxx11::string::~string((string *)&local_c10);
  std::allocator<char>::~allocator(&local_c11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c38,
             "        raise Exception(\'Prismatic Spline Sweep creation failed at merge.\')",
             &local_c39);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_c38);
  std::__cxx11::string::~string((string *)&local_c38);
  std::allocator<char>::~allocator(&local_c39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c60,"    final_pss = final_pss.removeSplitter()",&local_c61);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_c60);
  std::__cxx11::string::~string((string *)&local_c60);
  std::allocator<char>::~allocator(&local_c61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c88,
             "    pl = FreeCAD.Placement(fc_ps, FreeCAD.Rotation(FreeCAD.Vector(0,0,1), 0))",
             &local_c89);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_c88);
  std::__cxx11::string::~string((string *)&local_c88);
  std::allocator<char>::~allocator(&local_c89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cb0,"    final_pss.Placement = pl",&local_cb1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_cb0);
  std::__cxx11::string::~string((string *)&local_cb0);
  std::allocator<char>::~allocator(&local_cb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cd8,"    if final_pss.isNull()==True:",&local_cd9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_cd8);
  std::__cxx11::string::~string((string *)&local_cd8);
  std::allocator<char>::~allocator(&local_cd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d00,
             "        raise Exception(\'Prismatic Spline Sweep creation failed: return shape is null.\')"
             ,&local_d01);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_d00);
  std::__cxx11::string::~string((string *)&local_d00);
  std::allocator<char>::~allocator(&local_d01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d28,"    else:",&local_d29);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_d28);
  std::__cxx11::string::~string((string *)&local_d28);
  std::allocator<char>::~allocator(&local_d29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d50,"        te = time.perf_counter() - ts",&local_d51);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_d50);
  std::__cxx11::string::~string((string *)&local_d50);
  std::allocator<char>::~allocator(&local_d51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d78,"        fmt = format(te, \'.2f\')",&local_d79);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_d78);
  std::__cxx11::string::~string((string *)&local_d78);
  std::allocator<char>::~allocator(&local_d79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_da0,"        print(\'PSS created in \'+fmt+\' seconds.\')",&local_da1)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_da0);
  std::__cxx11::string::~string((string *)&local_da0);
  std::allocator<char>::~allocator(&local_da1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_dc8,"    return final_pss",&local_dc9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_dc8);
  std::__cxx11::string::~string((string *)&local_dc8);
  std::allocator<char>::~allocator(&local_dc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_df0,"",&local_df1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_df0);
  std::__cxx11::string::~string((string *)&local_df0);
  std::allocator<char>::~allocator(&local_df1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e18,"def create_prism(f_ingr):",&local_e19);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_e18);
  std::__cxx11::string::~string((string *)&local_e18);
  std::allocator<char>::~allocator(&local_e19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e40,"    ts = time.perf_counter()",&local_e41);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_e40);
  std::__cxx11::string::~string((string *)&local_e40);
  std::allocator<char>::~allocator(&local_e41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e68,"    fc_gp = [FreeCAD.Vector(i) for i in f_ingr.gp]",&local_e69);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_e68);
  std::__cxx11::string::~string((string *)&local_e68);
  std::allocator<char>::~allocator(&local_e69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e90,"    fc_ct = [FreeCAD.Vector(i) for i in f_ingr.ct]",&local_e91);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_e90);
  std::__cxx11::string::~string((string *)&local_e90);
  std::allocator<char>::~allocator(&local_e91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_eb8,"    fc_ps = FreeCAD.Vector(f_ingr.ps)",&local_eb9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_eb8);
  std::__cxx11::string::~string((string *)&local_eb8);
  std::allocator<char>::~allocator(&local_eb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ee0,"    wire = Part.makePolygon(fc_gp)",&local_ee1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_ee0);
  std::__cxx11::string::~string((string *)&local_ee0);
  std::allocator<char>::~allocator(&local_ee1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f08,"    gwire = Part.Wire(wire)",&local_f09);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_f08);
  std::__cxx11::string::~string((string *)&local_f08);
  std::allocator<char>::~allocator(&local_f09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f30,"    face = Part.Face(gwire)",&local_f31);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_f30);
  std::__cxx11::string::~string((string *)&local_f30);
  std::allocator<char>::~allocator(&local_f31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f58,"    last_p = len(fc_ct)-1",&local_f59);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_f58);
  std::__cxx11::string::~string((string *)&local_f58);
  std::allocator<char>::~allocator(&local_f59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f80,"    last_p_z = fc_ct[last_p].z",&local_f81);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_f80);
  std::__cxx11::string::~string((string *)&local_f80);
  std::allocator<char>::~allocator(&local_f81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fa8,"    prism = face.extrude(FreeCAD.Vector(0,0,last_p_z))",
             &local_fa9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_fa8);
  std::__cxx11::string::~string((string *)&local_fa8);
  std::allocator<char>::~allocator(&local_fa9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fd0,
             "    pl = FreeCAD.Placement(fc_ps, FreeCAD.Rotation(FreeCAD.Vector(0,0,1), 0))",
             &local_fd1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_fd0);
  std::__cxx11::string::~string((string *)&local_fd0);
  std::allocator<char>::~allocator(&local_fd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ff8,"    prism.Placement = pl",&local_ff9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_ff8);
  std::__cxx11::string::~string((string *)&local_ff8);
  std::allocator<char>::~allocator(&local_ff9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1020,"    if prism.isNull()==True:",&local_1021);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_1020);
  std::__cxx11::string::~string((string *)&local_1020);
  std::allocator<char>::~allocator(&local_1021);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1048,
             "        raise Exception(\'Prism creation failed: return shape is null.\')",&local_1049
            );
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_1048);
  std::__cxx11::string::~string((string *)&local_1048);
  std::allocator<char>::~allocator(&local_1049);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1070,"    else:",&local_1071);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_1070);
  std::__cxx11::string::~string((string *)&local_1070);
  std::allocator<char>::~allocator(&local_1071);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1098,"        te = time.perf_counter() - ts",&local_1099);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_1098);
  std::__cxx11::string::~string((string *)&local_1098);
  std::allocator<char>::~allocator(&local_1099);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10c0,"        fmt = format(te, \'.2f\')",&local_10c1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_10c0);
  std::__cxx11::string::~string((string *)&local_10c0);
  std::allocator<char>::~allocator(&local_10c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10e8,"        print(\'Prism created in \'+fmt+\' seconds.\')",
             &local_10e9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_10e8);
  std::__cxx11::string::~string((string *)&local_10e8);
  std::allocator<char>::~allocator(&local_10e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1110,"    return prism",&local_1111);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_1110);
  std::__cxx11::string::~string((string *)&local_1110);
  std::allocator<char>::~allocator(&local_1111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1138,
             "# Generated cell description ====================================",&local_1139);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_1138);
  std::__cxx11::string::~string((string *)&local_1138);
  std::allocator<char>::~allocator(&local_1139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1160,"# Line for MS Windows compatibility",&local_1161);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_1160);
  std::__cxx11::string::~string((string *)&local_1160);
  std::allocator<char>::~allocator(&local_1161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1188,"if __name__ == \'__main__\':",&local_1189);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_1188);
  std::__cxx11::string::~string((string *)&local_1188);
  std::allocator<char>::~allocator(&local_1189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_11b0,"    time_start = time.perf_counter()",&local_11b1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_11b0);
  std::__cxx11::string::~string((string *)&local_11b0);
  std::allocator<char>::~allocator(&local_11b1);
  return;
}

Assistant:

void MODEL3D::three_dim_model::initialize_python_script()
{
    py_script.clear();
    py_script.push_back("\"\"\"Python Circuit TCAD Script Generated with Katana\"\"\"");
    py_script.push_back("# Initialization ================================================");
    py_script.push_back("import FreeCAD, Part, time");
    if(enable_multiprocessing==true)
        py_script.push_back("import concurrent.futures");
    py_script.push_back("from FreeCAD import Base");
    py_script.push_back("My_doc = FreeCAD.newDocument(\""+cell_name+"\")");
    py_script.push_back("");
    py_script.push_back("# Set up functions ==============================================");
    py_script.push_back("class Ingredient:");
    py_script.push_back("    def __init__(self, gp, ct, ps, sb, of):");
    py_script.push_back("        self.gp = gp                        # Ground Plane");
    py_script.push_back("        self.ct = ct                        # Contour");
    py_script.push_back("        self.ps = ps                        # Position");
    py_script.push_back("        self.sb = sb                        # Start Base (True/False");
    py_script.push_back("        self.of = of 				         # Overlap Factor");
    py_script.push_back("");
    py_script.push_back("def create_pss(f_ingr):");
    py_script.push_back("    #convert base and contour to freecad vector");
    py_script.push_back("    ts = time.perf_counter()");
    py_script.push_back("    fc_gp = [FreeCAD.Vector(i) for i in f_ingr.gp]");
    py_script.push_back("    fc_ct = [FreeCAD.Vector(i) for i in f_ingr.ct]");
    py_script.push_back("    fc_ps = FreeCAD.Vector(f_ingr.ps)");
    py_script.push_back("    #create the shape");
    py_script.push_back("    wire = Part.makePolygon(fc_gp)");
    py_script.push_back("    gwire = Part.Wire(wire)");
    py_script.push_back("    last_p = len(fc_ct)-1");
    py_script.push_back("    last_p_z = fc_ct[last_p].z");
    py_script.push_back("    spline = Part.BSplineCurve(fc_ct)");
    py_script.push_back("    if (f_ingr.sb==True): # not inverted");
    py_script.push_back("        if ((f_ingr.of>1)and(f_ingr.of<=2)):#has overlap scale");
    py_script.push_back("            offset_lower_pt = FreeCAD.Vector(-fc_ct[last_p].x*f_ingr.of, fc_ct[0].y, fc_ct[0].z)");
    py_script.push_back("            offset_upper_pt = FreeCAD.Vector(offset_lower_pt.x, fc_ct[last_p].y, fc_ct[last_p].z)");
    py_script.push_back("            offset_ln = Part.LineSegment(spline.StartPoint, offset_lower_pt)");
    py_script.push_back("            vert_ln = Part.LineSegment(offset_lower_pt, offset_upper_pt)");
    py_script.push_back("            horiz_ln = Part.LineSegment(offset_upper_pt, spline.EndPoint)");
    py_script.push_back("            profile = Part.Shape([offset_ln, vert_ln, horiz_ln, spline])");
    py_script.push_back("        elif ( f_ingr.of == 1 ):#no overlap scale");
    py_script.push_back("            upper_point = FreeCAD.Vector(spline.StartPoint.x, spline.StartPoint.y, spline.EndPoint.z)");
    py_script.push_back("            vertical_ln = Part.LineSegment(spline.StartPoint, upper_point)");
    py_script.push_back("            horiz_ln = Part.LineSegment(upper_point, spline.EndPoint)");
    py_script.push_back("            profile = Part.Shape([vertical_ln, horiz_ln, spline])");
    py_script.push_back("        else:");
    py_script.push_back("            raise Exception('Overlap factor must be within the range [1, 2]')");
    py_script.push_back("        profile_wire = Part.Wire(profile.Edges)");
    py_script.push_back("        pl = FreeCAD.Placement(FreeCAD.Vector(0,0,0), FreeCAD.Rotation(FreeCAD.Vector(0,0,1), 180))");
    py_script.push_back("        profile_wire.Placement = pl");
    py_script.push_back("    else: # inverted");
    py_script.push_back("        if ((f_ingr.of>1)and(f_ingr.of<=2)): #has overlap scale");
    py_script.push_back("            spline_end = fc_ct[last_p]");
    py_script.push_back("            offset_point = FreeCAD.Vector( (fc_ct[last_p].x*f_ingr.of), fc_ct[last_p].y, fc_ct[last_p].z )");
    py_script.push_back("            offset_upper = Part.LineSegment(spline_end, offset_point)");
    py_script.push_back("            base_point = FreeCAD.Vector(offset_point.x,0,0)");
    py_script.push_back("            vert_ln = Part.LineSegment(offset_point, base_point)");
    py_script.push_back("            horiz_ln = Part.LineSegment(base_point, spline.StartPoint)");
    py_script.push_back("            profile = Part.Shape([spline, offset_upper, vert_ln, horiz_ln])");
    py_script.push_back("        elif (f_ingr.of==1):#no overlap scale");
    py_script.push_back("            lower_point = FreeCAD.Vector(spline.EndPoint.x, spline.EndPoint.y, 0)");
    py_script.push_back("            vert_ln = Part.LineSegment(spline.EndPoint, lower_point)");
    py_script.push_back("            horiz_ln = Part.LineSegment(lower_point, spline.StartPoint)");
    py_script.push_back("            profile = Part.Shape([spline, vert_ln, horiz_ln])");
    py_script.push_back("        else:");
    py_script.push_back("            raise Exception('Overlap factor must be within the range [1, 2]')");
    py_script.push_back("        profile_wire = Part.Wire(profile.Edges)");
    py_script.push_back("        pl = FreeCAD.Placement(FreeCAD.Vector(-fc_ct[last_p].x,0,0), FreeCAD.Rotation(FreeCAD.Vector(0,0,1), 0))");
    py_script.push_back("        profile_wire.Placement = pl");
    py_script.push_back("    makeSolid=True");
    py_script.push_back("    isFrenet=True");
    py_script.push_back("    TransitionMode=2#rounded edges");
    py_script.push_back("    os = gwire.makePipeShell([profile_wire],makeSolid,isFrenet, TransitionMode)");
    py_script.push_back("    os=os.removeSplitter()");
    py_script.push_back("    if os.isNull()==True:");
    py_script.push_back("        raise Exception('Prismatic Spline Sweep creation failed: sweep is null.')");
    py_script.push_back("    face = Part.Face(wire)");
    py_script.push_back("    prism = face.extrude(FreeCAD.Vector(0,0,last_p_z))");
    py_script.push_back("    final_pss = os.fuse(prism)");
    py_script.push_back("    if final_pss.isNull()==True:");
    py_script.push_back("        raise Exception('Prismatic Spline Sweep creation failed at merge.')");
    py_script.push_back("    final_pss = final_pss.removeSplitter()");
    py_script.push_back("    pl = FreeCAD.Placement(fc_ps, FreeCAD.Rotation(FreeCAD.Vector(0,0,1), 0))");
    py_script.push_back("    final_pss.Placement = pl");
    py_script.push_back("    if final_pss.isNull()==True:");
    py_script.push_back("        raise Exception('Prismatic Spline Sweep creation failed: return shape is null.')");
    py_script.push_back("    else:");
    py_script.push_back("        te = time.perf_counter() - ts");
    py_script.push_back("        fmt = format(te, '.2f')");
    py_script.push_back("        print('PSS created in '+fmt+' seconds.')");
    py_script.push_back("    return final_pss");
    py_script.push_back("");
    // Prism for Al layers
    py_script.push_back("def create_prism(f_ingr):");
    py_script.push_back("    ts = time.perf_counter()");
    py_script.push_back("    fc_gp = [FreeCAD.Vector(i) for i in f_ingr.gp]");
    py_script.push_back("    fc_ct = [FreeCAD.Vector(i) for i in f_ingr.ct]");
    py_script.push_back("    fc_ps = FreeCAD.Vector(f_ingr.ps)");
    py_script.push_back("    wire = Part.makePolygon(fc_gp)");
    py_script.push_back("    gwire = Part.Wire(wire)");
    py_script.push_back("    face = Part.Face(gwire)");
    py_script.push_back("    last_p = len(fc_ct)-1");
    py_script.push_back("    last_p_z = fc_ct[last_p].z");
    py_script.push_back("    prism = face.extrude(FreeCAD.Vector(0,0,last_p_z))");
    py_script.push_back("    pl = FreeCAD.Placement(fc_ps, FreeCAD.Rotation(FreeCAD.Vector(0,0,1), 0))");
    py_script.push_back("    prism.Placement = pl");
    py_script.push_back("    if prism.isNull()==True:");
    py_script.push_back("        raise Exception('Prism creation failed: return shape is null.')");
    py_script.push_back("    else:");
    py_script.push_back("        te = time.perf_counter() - ts");
    py_script.push_back("        fmt = format(te, '.2f')");
    py_script.push_back("        print('Prism created in '+fmt+' seconds.')");
    py_script.push_back("    return prism");
    py_script.push_back("# Generated cell description ====================================");
    py_script.push_back("# Line for MS Windows compatibility");
    py_script.push_back("if __name__ == '__main__':");
    py_script.push_back("    time_start = time.perf_counter()");
}